

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O0

void __thiscall ArgParser::startQuack(ArgParser *this)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"quack",&local_31);
  QPDFArgParser::selectOptionTable(&this->ap,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  bVar1 = QPDFArgParser::isCompleting(&this->ap);
  if (((bVar1) && (bVar1 = QPDFArgParser::isCompleting(&this->ap), bVar1)) &&
     (iVar2 = QPDFArgParser::argsLeft(&this->ap), iVar2 == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"something",&local_69);
    QPDFArgParser::insertCompletion(&this->ap,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"anything",&local_91);
    QPDFArgParser::insertCompletion(&this->ap,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return;
}

Assistant:

void
ArgParser::startQuack()
{
    this->ap.selectOptionTable("quack");
    if (this->ap.isCompleting()) {
        if (this->ap.isCompleting() && (this->ap.argsLeft() == 0)) {
            this->ap.insertCompletion("something");
            this->ap.insertCompletion("anything");
        }
        return;
    }
}